

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O3

int __thiscall
trieste::NodeDef::clone(NodeDef *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  size_type *psVar1;
  undefined8 *puVar2;
  NodeDef *this_00;
  undefined *puVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> __child_stack_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  undefined8 *puVar4;
  Node NVar5;
  undefined1 auStack_58 [24];
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  size_t sStack_30;
  
  puVar3 = (undefined *)(ulong)(uint)__flags;
  auStack_58._16_8_ = *(undefined8 *)(__fn + 0x18);
  local_40 = *(element_type **)(__fn + 0x20);
  if (local_40 != (element_type *)0x0) {
    puVar3 = &__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      psVar1 = &(local_40->origin_)._M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
      UNLOCK();
    }
    else {
      psVar1 = &(local_40->origin_)._M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
    }
  }
  local_38._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(__fn + 0x28);
  sStack_30 = *(size_t *)(__fn + 0x30);
  NVar5 = create(this,(Token *)(__fn + 0x10),(Location *)(auStack_58 + 0x10));
  __child_stack_00 =
       NVar5.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_40 != (element_type *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40);
    __child_stack_00._M_pi = extraout_RDX;
  }
  puVar2 = *(undefined8 **)(__fn + 0x60);
  for (puVar4 = *(undefined8 **)(__fn + 0x58); puVar4 != puVar2; puVar4 = puVar4 + 2) {
    this_00 = (this->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
              super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    clone((NodeDef *)auStack_58,(__fn *)*puVar4,__child_stack_00._M_pi,(int)puVar3,__arg);
    push_back(this_00,(Node *)auStack_58);
    __child_stack_00._M_pi = extraout_RDX_00;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_58._8_8_);
      __child_stack_00._M_pi = extraout_RDX_01;
    }
  }
  return (int)this;
}

Assistant:

Node clone()
    {
      // This doesn't preserve the symbol table.
      auto node = create(type_, location_);

      for (auto& child : children)
        node->push_back(child->clone());

      return node;
    }